

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::scanBlockEntry(Scanner *this)

{
  uint ToColumn;
  undefined1 local_68 [8];
  Token T;
  Scanner *this_local;
  
  ToColumn = this->Column;
  T.Value.field_2._8_8_ =
       AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
       ::end(&this->TokenQueue);
  rollIndent(this,ToColumn,TK_BlockSequenceStart,(iterator)T.Value.field_2._8_8_);
  removeSimpleKeyCandidatesOnFlowLevel(this,this->FlowLevel);
  this->IsSimpleKeyAllowed = true;
  Token::Token((Token *)local_68);
  local_68._0_4_ = TK_BlockEntry;
  T._0_8_ = this->Current;
  T.Range.Data = (char *)0x1;
  skip(this,1);
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,(Token *)local_68);
  Token::~Token((Token *)local_68);
  return true;
}

Assistant:

bool Scanner::scanBlockEntry() {
  rollIndent(Column, Token::TK_BlockSequenceStart, TokenQueue.end());
  removeSimpleKeyCandidatesOnFlowLevel(FlowLevel);
  IsSimpleKeyAllowed = true;
  Token T;
  T.Kind = Token::TK_BlockEntry;
  T.Range = StringRef(Current, 1);
  skip(1);
  TokenQueue.push_back(T);
  return true;
}